

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

iterator __thiscall
re2::SparseArray<re2::NFA::Thread_*>::SetInternal
          (SparseArray<re2::NFA::Thread_*> *this,bool allow_existing,int i,Thread **v)

{
  bool bVar1;
  uint uVar2;
  iterator pIVar3;
  Thread **v_local;
  int i_local;
  bool allow_existing_local;
  SparseArray<re2::NFA::Thread_*> *this_local;
  
  DebugCheckInvariants(this);
  uVar2 = max_size(this);
  if (uVar2 <= (uint)i) {
    __assert_fail("false && \"illegal index\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/sparse_array.h"
                  ,0xd5,
                  "iterator re2::SparseArray<re2::NFA::Thread *>::SetInternal(bool, int, const Value &) [Value = re2::NFA::Thread *]"
                 );
  }
  if (allow_existing) {
    bVar1 = has_index(this,i);
    if (!bVar1) {
      create_index(this,i);
    }
  }
  else {
    bVar1 = has_index(this,i);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!has_index(i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/sparse_array.h"
                    ,0xdc,
                    "iterator re2::SparseArray<re2::NFA::Thread *>::SetInternal(bool, int, const Value &) [Value = re2::NFA::Thread *]"
                   );
    }
    create_index(this,i);
  }
  pIVar3 = SetExistingInternal(this,i,v);
  return pIVar3;
}

Assistant:

iterator SetInternal(bool allow_existing, int i, const Value& v) {
    DebugCheckInvariants();
    if (static_cast<uint32_t>(i) >= static_cast<uint32_t>(max_size())) {
      assert(false && "illegal index");
      // Semantically, end() would be better here, but we already know
      // the user did something stupid, so begin() insulates them from
      // dereferencing an invalid pointer.
      return begin();
    }
    if (!allow_existing) {
      assert(!has_index(i));
      create_index(i);
    } else {
      if (!has_index(i))
        create_index(i);
    }
    return SetExistingInternal(i, v);
  }